

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall
Graph::Graph(Graph *this,
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *param,int car_capacity,int num_car)

{
  undefined8 *puVar1;
  int iVar2;
  pointer pvVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  ostream *poVar6;
  long *plVar7;
  Node *pNVar8;
  ulong *puVar9;
  double **ppdVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int *piVar16;
  ulong uVar17;
  
  uVar14 = (ulong)num_car;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar14;
  uVar17 = SUB168(auVar5 * ZEXT816(0x30),0) | 8;
  if (SUB168(auVar5 * ZEXT816(0x30),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  this->_vptr_Graph = (_func_int **)&PTR__Graph_0010ad80;
  this->num_car = num_car;
  this->num_node =
       (int)((ulong)((long)(param->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(param->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"constructor!",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"num_car:",8);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,num_car);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," car_capacity:",0xe);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,car_capacity);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," num_node(depot + customer):",0x1c);
  plVar7 = (long *)std::ostream::operator<<(poVar6,this->num_node);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  iVar2 = this->num_node;
  lVar15 = (long)iVar2;
  uVar12 = lVar15 << 5;
  if (lVar15 < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  pNVar8 = (Node *)operator_new__(uVar12);
  this->nodes = pNVar8;
  puVar9 = (ulong *)operator_new__(uVar17);
  *puVar9 = uVar14;
  if (num_car != 0) {
    lVar13 = 0;
    do {
      puVar1 = (undefined8 *)((long)puVar9 + lVar13 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)puVar9 + lVar13 + 0x30) = 0;
      lVar13 = lVar13 + 0x30;
    } while (uVar14 * 0x30 != lVar13);
  }
  this->cars = (Car *)(puVar9 + 1);
  if (0 < iVar2) {
    pvVar3 = (param->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar16 = &pNVar8->unload_time;
    lVar13 = 0;
    do {
      piVar4 = *(int **)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data + lVar13);
      piVar16[-5] = *piVar4;
      ((Node *)(piVar16 + -7))->x = piVar4[1];
      piVar16[-6] = piVar4[2];
      piVar16[-4] = piVar4[3];
      *(bool *)(piVar16 + -3) = false;
      piVar16[-2] = piVar4[4];
      piVar16[-1] = piVar4[5];
      *piVar16 = (int)((double)(piVar4[5] - piVar4[4]) * 0.2);
      piVar16 = piVar16 + 8;
      lVar13 = lVar13 + 0x18;
    } while (lVar15 * 0x18 != lVar13);
  }
  if (0 < num_car) {
    lVar13 = 0;
    do {
      *(int *)((long)puVar9 + lVar13 + 8) = car_capacity;
      puVar1 = (undefined8 *)((long)puVar9 + lVar13 + 0xc);
      *puVar1 = 0;
      puVar1[1] = 10;
      lVar13 = lVar13 + 0x30;
    } while ((ulong)(uint)num_car * 0x30 != lVar13);
  }
  uVar14 = 0xffffffffffffffff;
  if (-1 < iVar2) {
    uVar14 = lVar15 * 8;
  }
  ppdVar10 = (double **)operator_new__(uVar14);
  this->distance_matrix = ppdVar10;
  if (0 < iVar2) {
    lVar13 = 0;
    do {
      pdVar11 = (double *)operator_new__(uVar14);
      this->distance_matrix[lVar13] = pdVar11;
      memset(this->distance_matrix[lVar13],0,lVar15 * 8);
      lVar13 = lVar13 + 1;
    } while (lVar15 != lVar13);
  }
  calc_node_distance(this);
  return;
}

Assistant:

Graph::Graph(std::vector<std::vector<int> > param,
				int car_capacity, int num_car)
{
	this->num_car = num_car;
	this->num_node = param.size(); 

	std::cout << "constructor!" << std::endl;
	std::cout << "num_car:" << num_car << " car_capacity:" \
		<< car_capacity << " num_node(depot + customer):" << num_node << std::endl;

	nodes = new Node[num_node];
	cars = new Car[num_car];

	for(int i = 0; i < num_node; i++){
		nodes[i].idx = param[i][0];
		nodes[i].x = param[i][1];
		nodes[i].y = param[i][2];
		nodes[i].demand = param[i][3];
		nodes[i].visited = false;
		//time windows
		nodes[i].tw_open = param[i][4];
		nodes[i].tw_close = param[i][5];
		nodes[i].unload_time = (int)(0.2 * (param[i][5] - param[i][4]));
	}

	for(int i = 0; i < num_car; i++){
		cars[i].car_capacity = car_capacity;
		cars[i].now_load = 0;
		cars[i].now_idx = 0;
		//time windows
		cars[i].car_speed = 10;
		cars[i].now_time = 0;
	}

	distance_matrix = new double* [num_node]; 
	for(int i = 0; i < num_node; i++){
		distance_matrix[i] = new double [num_node];
		for(int j = 0; j < num_node; j++){
			distance_matrix[i][j] = 0;// initialization all elements in a row
		}
	}
	calc_node_distance();
}